

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::computeInfeasibilitiesForReporting(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase)

{
  int in_EDX;
  int in_ESI;
  HEkk *in_stack_00000030;
  HEkk *in_stack_00000060;
  
  if (in_ESI == 1) {
    computeSimplexInfeasible((HEkk *)CONCAT44(1,in_EDX));
  }
  else {
    computeSimplexPrimalInfeasible(in_stack_00000060);
    if (in_EDX == 1) {
      computeSimplexLpDualInfeasible(in_stack_00000060);
    }
    else {
      computeSimplexDualInfeasible(in_stack_00000030);
    }
  }
  return;
}

Assistant:

void HEkk::computeInfeasibilitiesForReporting(const SimplexAlgorithm algorithm,
                                              const HighsInt solve_phase) {
  if (algorithm == SimplexAlgorithm::kPrimal) {
    // Report the primal and dual infeasibilities
    computeSimplexInfeasible();
  } else {
    // Report the primal infeasibilities
    computeSimplexPrimalInfeasible();
    if (solve_phase == kSolvePhase1) {
      // In phase 1, report the simplex LP dual infeasibilities
      computeSimplexLpDualInfeasible();
    } else {
      // In phase 2, report the simplex dual infeasibilities
      computeSimplexDualInfeasible();
    }
  }
}